

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char **argv_00;
  cmCTestScriptHandler *this;
  ostream *poVar4;
  bool collapse;
  ulong uVar5;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  CommandLineArguments encoding_args;
  ostringstream cmCTestLog_msg;
  cmCTest inst;
  string local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_758;
  long *local_740;
  long local_730 [2];
  CommandLineArguments local_720;
  undefined1 local_708 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8 [6];
  ios_base local_698 [264];
  cmCTest local_590;
  
  cmsys::Encoding::CommandLineArguments::Main(&local_720,argc,argv);
  uVar2 = cmsys::Encoding::CommandLineArguments::argc(&local_720);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&local_720);
  cmSystemTools::DoNotInheritStdPipes();
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(*argv_00);
  if (1 < (int)uVar2) {
    iVar3 = strcmp(argv_00[1],"--launch");
    if (iVar3 == 0) {
      uVar2 = cmCTestLaunch::Main(uVar2,argv_00);
      goto LAB_00281bed;
    }
  }
  cmCTest::cmCTest(&local_590);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_708,(SystemTools *)0x1,collapse);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_708._1_7_,local_708[0]) != local_6f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_708._1_7_,local_708[0]),local_6f8[0]._M_allocated_capacity + 1
                   );
  }
  if ((pointer)local_708._8_8_ == (pointer)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_708,"Current working directory cannot be established.",0x30);
    std::ios::widen((char)(ostream *)local_708 +
                    (char)*(undefined8 *)(CONCAT71(local_708._1_7_,local_708[0]) + -0x18));
    std::ostream::put((char)local_708);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmCTest::Log(&local_590,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0x9b,local_778._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,
                      CONCAT71(local_778.field_2._M_allocated_capacity._1_7_,
                               local_778.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
    std::ios_base::~ios_base(local_698);
    uVar2 = 1;
  }
  else {
    if ((int)uVar2 < 2) {
      bVar1 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
      if (!bVar1) {
        bVar1 = cmsys::SystemTools::FileExists("DartTestfile.txt");
        if (!bVar1) {
          if (uVar2 == 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_708,"*********************************",0x21);
            std::ios::widen((char)(ostream *)local_708 +
                            (char)*(undefined8 *)(CONCAT71(local_708._1_7_,local_708[0]) + -0x18));
            std::ostream::put((char)local_708);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"No test configuration file found!",0x21);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"*********************************",0x21);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            cmCTest::Log(&local_590,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                         ,0xa9,local_778._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_778._M_dataplus._M_p != &local_778.field_2) {
              operator_delete(local_778._M_dataplus._M_p,
                              CONCAT71(local_778.field_2._M_allocated_capacity._1_7_,
                                       local_778.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
            std::ios_base::~ios_base(local_698);
          }
          goto LAB_00281758;
        }
      }
    }
    else {
LAB_00281758:
      cmDocumentation::cmDocumentation((cmDocumentation *)local_708);
      cmDocumentation::addCTestStandardDocSections((cmDocumentation *)local_708);
      bVar1 = cmDocumentation::CheckOptions((cmDocumentation *)local_708,uVar2,argv_00,(char *)0x0);
      if (bVar1) {
        this = (cmCTestScriptHandler *)cmCTest::GetHandler(&local_590,"script");
        cmCTestScriptHandler::CreateCMake(this);
        local_708[0] = (ostringstream)0x0;
        local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"ctest","");
        cmDocumentation::SetName((cmDocumentation *)local_708,&local_778);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,
                          CONCAT71(local_778.field_2._M_allocated_capacity._1_7_,
                                   local_778.field_2._M_local_buf[0]) + 1);
        }
        cmDocumentation::SetSection((cmDocumentation *)local_708,"Name",cmDocumentationName);
        cmDocumentation::SetSection((cmDocumentation *)local_708,"Usage",cmDocumentationUsage);
        cmDocumentation::PrependSection
                  ((cmDocumentation *)local_708,"Options",cmDocumentationOptions);
        bVar1 = cmDocumentation::PrintRequestedDocumentation
                          ((cmDocumentation *)local_708,(ostream *)&std::cout);
        uVar2 = (uint)!bVar1;
        cmDocumentation::~cmDocumentation((cmDocumentation *)local_708);
        goto LAB_00281be0;
      }
      cmDocumentation::~cmDocumentation((cmDocumentation *)local_708);
    }
    local_758.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_758.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_758.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        std::__cxx11::string::string((string *)local_708,argv_00[uVar5],(allocator *)&local_778);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_708._1_7_,local_708[0]) != local_6f8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_708._1_7_,local_708[0]),
                          local_6f8[0]._M_allocated_capacity + 1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    local_778._M_string_length = 0;
    local_778.field_2._M_local_buf[0] = '\0';
    local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
    uVar2 = cmCTest::Run(&local_590,&local_758,&local_778);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_708,local_778._M_dataplus._M_p,local_778._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCTest::Log(&local_590,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/ctest.cxx"
                 ,0xc4,(char *)local_740,false);
    if (local_740 != local_730) {
      operator_delete(local_740,local_730[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
    std::ios_base::~ios_base(local_698);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,
                      CONCAT71(local_778.field_2._M_allocated_capacity._1_7_,
                               local_778.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_758);
  }
LAB_00281be0:
  cmCTest::~cmCTest(&local_590);
LAB_00281bed:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_720);
  return uVar2;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::DoNotInheritStdPipes();
  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(argv[0]);

  // Dispatch 'ctest --launch' mode directly.
  if (argc >= 2 && strcmp(argv[1], "--launch") == 0) {
    return cmCTestLaunch::Main(argc, argv);
  }

  cmCTest inst;

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCTestLog(&inst, ERROR_MESSAGE,
               "Current working directory cannot be established."
                 << std::endl);
    return 1;
  }

  // If there is a testing input file, check for documentation options
  // only if there are actually arguments.  We want running without
  // arguments to run tests.
  if (argc > 1 ||
      !(cmSystemTools::FileExists("CTestTestfile.cmake") ||
        cmSystemTools::FileExists("DartTestfile.txt"))) {
    if (argc == 1) {
      cmCTestLog(&inst, ERROR_MESSAGE, "*********************************"
                   << std::endl
                   << "No test configuration file found!" << std::endl
                   << "*********************************" << std::endl);
    }
    cmDocumentation doc;
    doc.addCTestStandardDocSections();
    if (doc.CheckOptions(argc, argv)) {
      // Construct and print requested documentation.
      cmCTestScriptHandler* ch =
        static_cast<cmCTestScriptHandler*>(inst.GetHandler("script"));
      ch->CreateCMake();

      doc.SetShowGenerators(false);
      doc.SetName("ctest");
      doc.SetSection("Name", cmDocumentationName);
      doc.SetSection("Usage", cmDocumentationUsage);
      doc.PrependSection("Options", cmDocumentationOptions);
      return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
    }
  }

  // copy the args to a vector
  std::vector<std::string> args;
  for (int i = 0; i < argc; ++i) {
    args.push_back(argv[i]);
  }
  // run ctest
  std::string output;
  int res = inst.Run(args, &output);
  cmCTestLog(&inst, OUTPUT, output);

  return res;
}